

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O2

float Scl_LibLookup(SC_Surface *p,float slew,float load)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float *pfVar5;
  void *pvVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint i;
  float fVar11;
  float fVar12;
  
  lVar8 = (long)(p->vIndex0).nSize;
  if ((lVar8 == 1) && ((p->vIndex1).nSize == 1)) {
    pvVar6 = Vec_PtrEntry(&p->vData,0);
    if ((p->vData).nSize != 1) {
      __assert_fail("Vec_PtrSize(&p->vData) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                    ,0x1e9,"float Scl_LibLookup(SC_Surface *, float, float)");
    }
    if (*(int *)((long)pvVar6 + 4) != 1) {
      __assert_fail("Vec_FltSize(vTemp) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                    ,0x1ea,"float Scl_LibLookup(SC_Surface *, float, float)");
    }
    fVar11 = **(float **)((long)pvVar6 + 8);
  }
  else {
    pfVar4 = (p->vIndex0).pArray;
    lVar8 = lVar8 + -1;
    lVar9 = 1;
    if (1 < (int)lVar8) {
      lVar9 = lVar8;
    }
    i = (uint)lVar9;
    for (lVar9 = 1; lVar9 < lVar8; lVar9 = lVar9 + 1) {
      if (slew < pfVar4[lVar9]) {
        i = (uint)lVar9;
        break;
      }
    }
    pfVar5 = (p->vIndex1).pArray;
    lVar9 = (long)(p->vIndex1).nSize + -1;
    lVar8 = 1;
    if (1 < (int)lVar9) {
      lVar8 = lVar9;
    }
    uVar7 = (uint)lVar8;
    for (lVar8 = 1; lVar8 < lVar9; lVar8 = lVar8 + 1) {
      if (load < pfVar5[lVar8]) {
        uVar7 = (uint)lVar8;
        break;
      }
    }
    fVar1 = pfVar4[(int)(i - 1)];
    fVar2 = pfVar4[i];
    lVar9 = (long)(int)uVar7;
    uVar10 = (ulong)uVar7;
    fVar12 = (load - pfVar5[lVar9 + -1]) / (pfVar5[uVar10] - pfVar5[lVar9 + -1]);
    pvVar6 = Vec_PtrEntry(&p->vData,i - 1);
    lVar8 = *(long *)((long)pvVar6 + 8);
    pvVar6 = Vec_PtrEntry(&p->vData,i);
    fVar11 = *(float *)(lVar8 + -4 + lVar9 * 4);
    fVar3 = *(float *)(*(long *)((long)pvVar6 + 8) + -4 + lVar9 * 4);
    fVar11 = fVar12 * (*(float *)(lVar8 + uVar10 * 4) - fVar11) + fVar11;
    fVar11 = ((fVar12 * (*(float *)(*(long *)((long)pvVar6 + 8) + uVar10 * 4) - fVar3) + fVar3) -
             fVar11) * ((slew - fVar1) / (fVar2 - fVar1)) + fVar11;
  }
  return fVar11;
}

Assistant:

static inline float Scl_LibLookup( SC_Surface * p, float slew, float load )
{
    float * pIndex0, * pIndex1, * pDataS, * pDataS1;
    float sfrac, lfrac, p0, p1;
    int s, l;

    // handle constant table
    if ( Vec_FltSize(&p->vIndex0) == 1 && Vec_FltSize(&p->vIndex1) == 1 )
    {
        Vec_Flt_t * vTemp = (Vec_Flt_t *)Vec_PtrEntry(&p->vData, 0);
        assert( Vec_PtrSize(&p->vData) == 1 );
        assert( Vec_FltSize(vTemp) == 1 );
        return Vec_FltEntry(vTemp, 0);
    }

    // Find closest sample points in surface:
    pIndex0 = Vec_FltArray(&p->vIndex0);
    for ( s = 1; s < Vec_FltSize(&p->vIndex0)-1; s++ )
        if ( pIndex0[s] > slew )
            break;
    s--;

    pIndex1 = Vec_FltArray(&p->vIndex1);
    for ( l = 1; l < Vec_FltSize(&p->vIndex1)-1; l++ )
        if ( pIndex1[l] > load )
            break;
    l--;

    // Interpolate (or extrapolate) function value from sample points:
    sfrac = (slew - pIndex0[s]) / (pIndex0[s+1] - pIndex0[s]);
    lfrac = (load - pIndex1[l]) / (pIndex1[l+1] - pIndex1[l]);

    pDataS  = Vec_FltArray( (Vec_Flt_t *)Vec_PtrEntry(&p->vData, s) );
    pDataS1 = Vec_FltArray( (Vec_Flt_t *)Vec_PtrEntry(&p->vData, s+1) );

    p0 = pDataS [l] + lfrac * (pDataS [l+1] - pDataS [l]);
    p1 = pDataS1[l] + lfrac * (pDataS1[l+1] - pDataS1[l]);

    return p0 + sfrac * (p1 - p0);      // <<== multiply result with K factor here 
}